

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_stdio.cpp
# Opt level: O1

int os_get_event(unsigned_long timeout,int use_timeout,os_event_info_t *info)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 4;
  if (use_timeout == 0) {
    iVar1 = os_getc_raw();
    info->key[0] = iVar1;
    iVar2 = 1;
    if (iVar1 == 0) {
      iVar1 = os_getc_raw();
      info->key[1] = iVar1;
    }
  }
  return iVar2;
}

Assistant:

int os_get_event(unsigned long timeout, int use_timeout,
                 os_event_info_t *info)
{
    /* we can't handle timeouts */
    if (use_timeout)
        return OS_EVT_NOTIMEOUT;

    /* get a key */
    info->key[0] = os_getc_raw();
    if (info->key[0] == 0)
        info->key[1] = os_getc_raw();

    /* return the keyboard event */
    return OS_EVT_KEY;
}